

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LdStPre(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  DecodeStatus DVar7;
  MCInst *in_RCX;
  void *in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint addr;
  uint Rn;
  uint Rt;
  uint load;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc0;
  DecodeStatus RegNo;
  uint Val;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  RegNo = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x10,4);
  uVar4 = fieldFromInstruction_4(in_ESI,0,8);
  uVar5 = fieldFromInstruction_4(in_ESI,9,1);
  uVar6 = uVar3 << 9 | uVar5 << 8 | uVar4;
  uVar4 = fieldFromInstruction_4(in_ESI,0x14,1);
  if (uVar3 == 0xf) {
    uVar6 = MCInst_getOpcode(in_RDI);
    switch(uVar6) {
    case 0x94b:
    case 0x94c:
      MCInst_setOpcode(in_RDI,0x94f);
      uVar6 = (uint)((ulong)in_RDI >> 0x20);
      break;
    default:
      return MCDisassembler_Fail;
    case 0x95a:
    case 0x95b:
      MCInst_setOpcode(in_RDI,0x95e);
      uVar6 = (uint)((ulong)in_RDI >> 0x20);
      break;
    case 0x962:
    case 0x963:
      if (uVar2 == 0xf) {
        MCInst_setOpcode(in_RDI,0x9bd);
        uVar6 = (uint)((ulong)in_RDI >> 0x20);
      }
      else {
        MCInst_setOpcode(in_RDI,0x966);
        uVar6 = (uint)((ulong)in_RDI >> 0x20);
      }
      break;
    case 0x96a:
    case 0x96b:
      MCInst_setOpcode(in_RDI,0x96e);
      uVar6 = (uint)((ulong)in_RDI >> 0x20);
      break;
    case 0x972:
    case 0x973:
      MCInst_setOpcode(in_RDI,0x976);
      uVar6 = (uint)((ulong)in_RDI >> 0x20);
    }
    RegNo = DecodeT2LoadLabel((MCInst *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar6,
                              CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  }
  else {
    if (uVar4 == 0) {
      DVar7 = DecodeGPRRegisterClass
                        (in_RCX,RegNo,CONCAT44(uVar2,uVar3),
                         (void *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    Val = (uint)((ulong)in_RDX >> 0x20);
    DVar7 = DecodeGPRRegisterClass
                      (in_RCX,RegNo,CONCAT44(uVar2,uVar3),
                       (void *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
    if (_Var1) {
      if (uVar4 != 0) {
        DVar7 = DecodeGPRRegisterClass
                          (in_RCX,RegNo,CONCAT44(uVar2,uVar3),
                           (void *)CONCAT44(uVar6,in_stack_ffffffffffffffc0));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
      }
      DVar7 = DecodeT2AddrModeImm8
                        ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),Val,(uint64_t)in_RCX,
                         (void *)CONCAT44(RegNo,uVar4));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar7);
      if (!_Var1) {
        RegNo = MCDisassembler_Fail;
      }
    }
    else {
      RegNo = MCDisassembler_Fail;
    }
  }
  return RegNo;
}

Assistant:

static DecodeStatus DecodeT2LdStPre(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned load;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	addr |= fieldFromInstruction_4(Insn, 9, 1) << 8;
	addr |= Rn << 9;
	load = fieldFromInstruction_4(Insn, 20, 1);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDR_PRE:
			case ARM_t2LDR_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRB_PRE:
			case ARM_t2LDRB_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRH_PRE:
			case ARM_t2LDRH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSB_PRE:
			case ARM_t2LDRSB_POST:
				if (Rt == 15)
					MCInst_setOpcode(Inst, ARM_t2PLIpci);
				else
					MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSH_PRE:
			case ARM_t2LDRSH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;

	if (load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}